

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

void decompose(double *x,int N,int f,double *filter,char *type,double *trend,int *ltrend,
              double *seas,int *lseas,double *random,int *lrandom)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  double *inp2;
  ulong uVar5;
  double *oup;
  void *__ptr;
  void *__s;
  long lVar6;
  double *pdVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  size_t __size;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  
  uVar4 = (ulong)f;
  uVar15 = (ulong)(uint)f;
  inp2 = filter;
  if ((filter == (double *)0x0) && (inp2 = (double *)malloc(uVar4 * 8), 0 < f)) {
    uVar5 = 0;
    do {
      inp2[uVar5] = 1.0 / (double)f;
      uVar5 = uVar5 + 1;
    } while (uVar15 != uVar5);
  }
  iVar1 = strcmp(type,"additive");
  if ((iVar1 == 0) && (iVar1 = strcmp(type,"multiplicative"), iVar1 == 0)) {
    puts("Type takes only either additive or multiplicative values ");
    exit(-1);
  }
  uVar2 = (int)(((uint)(uVar4 >> 0x1f) & 1) + f) >> 1;
  iVar1 = N - f;
  oup = (double *)malloc((long)iVar1 * 8 + 8);
  convolve("valid","direct",x,N,inp2,f,oup);
  uVar8 = iVar1 + (f & 1U);
  __size = (long)(int)uVar8 * 8;
  __ptr = malloc(__size);
  __s = malloc(uVar4 * 8);
  iVar3 = strcmp(type,"multiplicative");
  if (iVar3 == 0) {
    if (0 < (int)uVar8) {
      lVar9 = 0;
      do {
        *(double *)((long)__ptr + lVar9 * 8) = x[(int)uVar2 + lVar9] / oup[lVar9];
        lVar6 = (int)uVar2 + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar6 + 1 < (long)(int)(uVar8 + uVar2));
    }
  }
  else {
    iVar3 = strcmp(type,"additive");
    if (0 < (int)uVar8 && iVar3 == 0) {
      lVar9 = 0;
      do {
        *(double *)((long)__ptr + lVar9 * 8) = x[(int)uVar2 + lVar9] - oup[lVar9];
        lVar6 = (int)uVar2 + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar6 + 1 < (long)(int)(uVar8 + uVar2));
    }
  }
  dVar16 = ceil((double)(int)uVar8 / (double)f);
  iVar3 = (int)dVar16;
  if (0 < f) {
    memset(__s,0,uVar15 * 8);
  }
  uVar13 = iVar3 - 1;
  if (1 < iVar3) {
    uVar5 = 0;
    pvVar12 = __ptr;
    do {
      if (0 < f) {
        uVar11 = 0;
        do {
          *(double *)((long)__s + uVar11 * 8) =
               *(double *)((long)pvVar12 + uVar11 * 8) + *(double *)((long)__s + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
      }
      uVar5 = uVar5 + 1;
      pvVar12 = (void *)((long)pvVar12 + uVar15 * 8);
    } while (uVar5 != uVar13);
  }
  iVar14 = uVar13 * f;
  uVar10 = uVar8 - iVar14;
  if (uVar10 != 0 && iVar14 <= (int)uVar8) {
    uVar5 = 0;
    do {
      *(double *)((long)__s + uVar5 * 8) =
           (*(double *)((long)__ptr + uVar5 * 8 + (long)iVar14 * 8) +
           *(double *)((long)__s + uVar5 * 8)) / (double)iVar3;
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  if ((int)uVar10 < f) {
    lVar9 = __size + (long)iVar14 * -8;
    lVar6 = 0;
    do {
      *(double *)((long)__s + lVar6 * 8 + lVar9) =
           *(double *)((long)__s + lVar6 * 8 + lVar9) / (double)(int)uVar13;
      lVar6 = lVar6 + 1;
    } while (((f & 0xfffffffeU) + iVar3 * f) - N != (int)lVar6);
  }
  if (f - uVar2 != 0 && (int)uVar2 <= f) {
    memcpy(seas,(void *)((long)__s + (long)(int)uVar2 * 8),(ulong)(~uVar2 + f) * 8 + 8);
  }
  if (1 < f) {
    lVar9 = 0;
    do {
      seas[(uVar4 + lVar9) - (long)(int)uVar2] = *(double *)((long)__s + (long)(int)lVar9 * 8);
      lVar6 = (int)(f - uVar2) + lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar6 + 1 < (long)uVar4);
  }
  if (1 < (int)uVar13) {
    pdVar7 = seas + uVar15;
    uVar4 = 1;
    do {
      if (0 < f) {
        uVar5 = 0;
        do {
          pdVar7[uVar5] = seas[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar15 != uVar5);
      }
      uVar4 = uVar4 + 1;
      pdVar7 = pdVar7 + uVar15;
    } while (uVar4 != uVar13);
  }
  if (iVar14 < (int)uVar10) {
    pdVar7 = seas;
    lVar9 = (long)iVar14;
    do {
      pdVar7[iVar14] = *pdVar7;
      lVar9 = lVar9 + 1;
      pdVar7 = pdVar7 + 1;
    } while (lVar9 < (int)uVar10);
  }
  iVar3 = uVar8 - 1;
  if ((f & 1U) == 0) {
    iVar3 = iVar1;
  }
  *lseas = iVar3;
  *lrandom = iVar3;
  memcpy(trend,oup,__size);
  *ltrend = uVar8;
  iVar1 = strcmp(type,"multiplicative");
  if (iVar1 == 0) {
    if (0 < (int)uVar8) {
      lVar9 = 0;
      do {
        random[lVar9] = x[(int)uVar2 + lVar9] / trend[lVar9];
        lVar6 = (int)uVar2 + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar6 + 1 < (long)(int)(uVar8 + uVar2));
      if (0 < (int)uVar8) {
        uVar4 = 0;
        do {
          random[uVar4] = random[uVar4] / seas[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
      }
    }
  }
  else {
    iVar1 = strcmp(type,"additive");
    if ((iVar1 == 0) && (0 < (int)uVar8)) {
      lVar9 = 0;
      do {
        random[lVar9] = x[(int)uVar2 + lVar9] - trend[lVar9];
        lVar6 = (int)uVar2 + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar6 + 1 < (long)(int)(uVar8 + uVar2));
      if (0 < (int)uVar8) {
        uVar4 = 0;
        do {
          random[uVar4] = random[uVar4] - seas[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar8 != uVar4);
      }
    }
  }
  if (filter == (double *)0x0) {
    free(inp2);
  }
  free(oup);
  free(__ptr);
  free(__s);
  return;
}

Assistant:

void decompose(double *x,int N, int f,double *filter, const char *type, double *trend, int *ltrend, double *seas, int *lseas, double *random, int *lrandom) {
    int isOdd,i,j,f2,clen,batches;
    double *filt,*cout,*detrend,*seasonalmeans;


    isOdd = f%2;

    if (filter == NULL) {
        filt = (double*) malloc(sizeof(double) * f);
        for(i = 0; i < f;++i) {
            filt[i] = 1.0 / (double) f;
        }
    } else {
        filt = &filter[0];
    }

    if (!(strcmp(type,"additive") || strcmp(type,"multiplicative"))) {
        printf("Type takes only either additive or multiplicative values \n");
        exit(-1);
    }

    f2 = f / 2;
    clen = N - f + 1;

    cout = (double*) malloc(sizeof(double) * clen);

    convolve("valid","direct",x,N,filt,f,cout);

    //mdisplay(cout,1,clen);

    if (!isOdd) {
        clen--;
    }

    detrend = (double*) malloc(sizeof(double) * clen);
    seasonalmeans = (double*) malloc(sizeof(double) * f);

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] / cout[i-f2];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] - cout[i-f2];
        }
    }

    //mdisplay(detrend,1,clen);

    findMeans(detrend,clen,f,seasonalmeans);

    for(i = 0; i < f-f2;++i) {
        seas[i] = seasonalmeans[f2+i];
    }

    for(i = f-f2; i < f;++i) {
        seas[i] = seasonalmeans[i-f+f2];
    }

    batches = ceil((double) clen / (double) f);

    for(i = 1; i < batches-1;++i) {
        for(j = 0; j < f;++j) {
            seas[i*f+j] =seas[j];
        }
    }
    j = 0;
    for( i = f*(batches-1); i < clen - f*(batches-1);++i) {
        seas[i] = seas[j];
        j++;
    }

    if (isOdd) {
        *lseas = clen - 1;
        *lrandom = clen - 1;
    } else {
        *lseas = clen;
        *lrandom = clen;
    }

    memcpy(trend,cout,sizeof(double)*clen);
    *ltrend = clen;

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] / trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] /seas[i];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] - trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] - seas[i];
        }
    }


    if (filter == NULL) {
        free(filt);
    }

    free(cout);
    free(detrend);
    free(seasonalmeans);
}